

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool IsWindowContentHoverable(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((((GImGui->FocusedWindow != (ImGuiWindow *)0x0) &&
       (pIVar1 = GImGui->FocusedWindow->RootWindow, pIVar1 != (ImGuiWindow *)0x0)) &&
      ((pIVar1->Flags & 0x2000000) != 0)) &&
     ((pIVar1->WasActive == true && (pIVar1 != window->RootWindow)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static inline bool IsWindowContentHoverable(ImGuiWindow* window)
{
    // An active popup disable hovering on other windows (apart from its own children)
    ImGuiContext& g = *GImGui;
    if (ImGuiWindow* focused_window = g.FocusedWindow)
        if (ImGuiWindow* focused_root_window = focused_window->RootWindow)
            if ((focused_root_window->Flags & ImGuiWindowFlags_Popup) != 0 && focused_root_window->WasActive && focused_root_window != window->RootWindow)
                return false;

    return true;
}